

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void avx::ProjectionProfile
               (uint32_t rowSize,uint8_t *imageStart,uint32_t height,bool horizontal,uint32_t *out,
               uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint8_t *puVar7;
  undefined7 in_register_00000009;
  uint8_t *puVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  
  if ((int)CONCAT71(in_register_00000009,horizontal) == 0) {
    puVar7 = imageStart + totalSimdWidth;
    puVar8 = imageStart + height * rowSize;
    while (imageStart != puVar8) {
      auVar12 = ZEXT1664((undefined1  [16])0x0);
      lVar10 = 0;
      while ((ulong)simdWidth << 5 != lVar10) {
        pauVar1 = (undefined1 (*) [32])(imageStart + lVar10);
        lVar10 = lVar10 + 0x20;
        auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar4 = vpunpcklbw_avx2(*pauVar1,auVar11);
        auVar3 = vpunpckhbw_avx2(*pauVar1,auVar11);
        auVar3 = vpaddw_avx2(auVar4,auVar3);
        auVar4 = vpunpcklwd_avx2(auVar3,auVar11);
        auVar3 = vpunpckhwd_avx2(auVar3,auVar11);
        auVar3 = vpaddd_avx2(auVar12._0_32_,auVar3);
        auVar3 = vpaddd_avx2(auVar3,auVar4);
        auVar12 = ZEXT3264(auVar3);
      }
      if (nonSimdWidth != 0) {
        for (uVar9 = 0; nonSimdWidth != uVar9; uVar9 = uVar9 + 1) {
          *out = *out + (uint)puVar7[uVar9];
        }
      }
      imageStart = imageStart + rowSize;
      puVar7 = puVar7 + rowSize;
      auVar2 = vphaddd_avx(auVar12._16_16_,auVar12._0_16_);
      auVar2 = vphaddd_avx(auVar2,auVar2);
      auVar2 = vphaddd_avx(auVar2,auVar2);
      *out = *out + auVar2._0_4_;
      out = out + 1;
    }
  }
  else {
    puVar8 = imageStart + totalSimdWidth;
    while (imageStart != puVar8) {
      auVar12 = ZEXT1664((undefined1  [16])0x0);
      auVar13 = ZEXT1664((undefined1  [16])0x0);
      auVar14 = ZEXT1664((undefined1  [16])0x0);
      auVar15 = ZEXT1664((undefined1  [16])0x0);
      uVar9 = 0;
      while( true ) {
        if (height * rowSize == uVar9) break;
        pauVar1 = (undefined1 (*) [32])(imageStart + uVar9);
        uVar9 = uVar9 + rowSize;
        auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar4 = vpunpcklbw_avx2(*pauVar1,auVar11);
        auVar3 = vpunpckhbw_avx2(*pauVar1,auVar11);
        auVar5 = vpunpcklwd_avx2(auVar4,auVar11);
        auVar6 = vpunpcklwd_avx2(auVar3,auVar11);
        auVar4 = vpunpckhwd_avx2(auVar4,auVar11);
        auVar11 = vpunpckhwd_avx2(auVar3,auVar11);
        auVar3 = vpaddd_avx2(auVar15._0_32_,auVar5);
        auVar15 = ZEXT3264(auVar3);
        auVar3 = vpaddd_avx2(auVar14._0_32_,auVar4);
        auVar14 = ZEXT3264(auVar3);
        auVar3 = vpaddd_avx2(auVar6,auVar13._0_32_);
        auVar13 = ZEXT3264(auVar3);
        auVar3 = vpaddd_avx2(auVar12._0_32_,auVar11);
        auVar12 = ZEXT3264(auVar3);
      }
      auVar3 = vpaddd_avx2(auVar15._0_32_,*(undefined1 (*) [32])out);
      imageStart = imageStart + 0x20;
      *(undefined1 (*) [32])out = auVar3;
      auVar3 = vpaddd_avx2(auVar14._0_32_,*(undefined1 (*) [32])((long)out + 0x20));
      *(undefined1 (*) [32])((long)out + 0x20) = auVar3;
      auVar3 = vpaddd_avx2(auVar13._0_32_,*(undefined1 (*) [32])((long)out + 0x40));
      *(undefined1 (*) [32])((long)out + 0x40) = auVar3;
      auVar3 = vpaddd_avx2(auVar12._0_32_,*(undefined1 (*) [32])((long)out + 0x60));
      *(undefined1 (*) [32])((long)out + 0x60) = auVar3;
      out = (uint32_t *)((long)out + 0x80);
    }
    if (nonSimdWidth != 0) {
      puVar7 = puVar8 + nonSimdWidth;
      for (; puVar8 != puVar7; puVar8 = puVar8 + 1) {
        for (uVar9 = 0; height * rowSize != uVar9; uVar9 = uVar9 + rowSize) {
          *(uint *)*(undefined1 (*) [32])out =
               *(int *)*(undefined1 (*) [32])out + (uint)puVar8[uVar9];
        }
        out = (uint32_t *)(*(undefined1 (*) [32])out + 4);
      }
    }
  }
  return;
}

Assistant:

void ProjectionProfile( uint32_t rowSize, const uint8_t * imageStart, uint32_t height, bool horizontal,
                            uint32_t * out, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd zero = _mm256_setzero_si256();

        if( horizontal ) {
            const uint8_t * imageSimdXEnd = imageStart + totalSimdWidth;

            for( ; imageStart != imageSimdXEnd; imageStart += simdSize, out += simdSize ) {
                const uint8_t * imageSimdY = imageStart;
                const uint8_t * imageSimdYEnd = imageSimdY + height * rowSize;
                simd simdSum_1 = _mm256_setzero_si256();
                simd simdSum_2 = _mm256_setzero_si256();
                simd simdSum_3 = _mm256_setzero_si256();
                simd simdSum_4 = _mm256_setzero_si256();

                simd * dst = reinterpret_cast <simd*> (out);

                for( ; imageSimdY != imageSimdYEnd; imageSimdY += rowSize) {
                    const simd * src    = reinterpret_cast <const simd*> (imageSimdY);

                    const simd data = _mm256_loadu_si256( src );

                    const simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                    const simd dataHi  = _mm256_unpackhi_epi8( data, zero );

                    const simd data_1 = _mm256_unpacklo_epi16( dataLo, zero );
                    const simd data_2 = _mm256_unpackhi_epi16( dataLo, zero );
                    const simd data_3 = _mm256_unpacklo_epi16( dataHi, zero );
                    const simd data_4 = _mm256_unpackhi_epi16( dataHi, zero );
                    simdSum_1 = _mm256_add_epi32( data_1, simdSum_1 );
                    simdSum_2 = _mm256_add_epi32( data_2, simdSum_2 );
                    simdSum_3 = _mm256_add_epi32( data_3, simdSum_3 );
                    simdSum_4 = _mm256_add_epi32( data_4, simdSum_4 );
                }

                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_1, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_2, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_3, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_4, _mm256_loadu_si256( dst ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t* imageXEnd = imageStart + nonSimdWidth;

                for( ; imageStart != imageXEnd; ++imageStart, ++out ) {
                    const uint8_t * imageY    = imageStart;
                    const uint8_t * imageYEnd = imageY + height * rowSize;

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*out) += (*imageY);
                }
            }
        }
        else {
            const uint8_t * imageYEnd = imageStart + height * rowSize;

            for( ; imageStart != imageYEnd; imageStart += rowSize, ++out ) {
                const simd * src    = reinterpret_cast <const simd*> (imageStart);
                const simd * srcEnd = src + simdWidth;
                simd simdSum = _mm256_setzero_si256();

                for( ; src != srcEnd; ++src ) {
                    simd data = _mm256_loadu_si256( src );

                    simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                    simd dataHi  = _mm256_unpackhi_epi8( data, zero );
                    simd sumLoHi = _mm256_add_epi16( dataLo, dataHi );

                    simdSum = _mm256_add_epi32( simdSum, _mm256_add_epi32( _mm256_unpacklo_epi16( sumLoHi, zero ),
                                                                           _mm256_unpackhi_epi16( sumLoHi, zero ) ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * imageX    = imageStart + totalSimdWidth;
                    const uint8_t * imageXEnd = imageX + nonSimdWidth;

                    for( ; imageX != imageXEnd; ++imageX )
                        (*out) += (*imageX);
                }

                uint32_t output[8] = { 0 };
                _mm256_storeu_si256( reinterpret_cast <simd*>(output), simdSum );
                
                (*out) += output[0] + output[1] + output[2] + output[3] + output[4] + output[5] + output[6] + output[7];
            }
        }
    }